

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O3

int32_t __thiscall
icu_63::number::impl::NumberFormatterImpl::format
          (NumberFormatterImpl *this,DecimalQuantity *inValue,NumberStringBuilder *outString,
          UErrorCode *status)

{
  int32_t end;
  int32_t iVar1;
  MicroProps micros;
  MicroProps local_118;
  
  MicroProps::MicroProps(&local_118);
  preProcess(this,inValue,&local_118,status);
  iVar1 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    end = writeNumber(&local_118,inValue,outString,0,status);
    iVar1 = writeAffixes(&local_118,outString,0,end,status);
    iVar1 = iVar1 + end;
  }
  local_118.super_MicroPropsGenerator._vptr_MicroPropsGenerator =
       (_func_int **)&PTR__MicroProps_003a8700;
  local_118.helpers.multiplier.super_MicroPropsGenerator._vptr_MicroPropsGenerator =
       (_func_int **)&PTR__MultiplierFormatHandler_003a8d78;
  Scale::~Scale(&local_118.helpers.multiplier.fMultiplier);
  Modifier::~Modifier(&local_118.helpers.emptyStrongModifier.super_Modifier);
  Modifier::~Modifier(&local_118.helpers.emptyWeakModifier.super_Modifier);
  Modifier::~Modifier((Modifier *)&local_118.helpers);
  return iVar1;
}

Assistant:

int32_t NumberFormatterImpl::format(DecimalQuantity& inValue, NumberStringBuilder& outString,
                                UErrorCode& status) const {
    MicroProps micros;
    preProcess(inValue, micros, status);
    if (U_FAILURE(status)) { return 0; }
    int32_t length = writeNumber(micros, inValue, outString, 0, status);
    length += writeAffixes(micros, outString, 0, length, status);
    return length;
}